

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

uint32_t kex_method_list(uchar *buf,uint32_t list_strlen,LIBSSH2_COMMON_METHOD **method)

{
  size_t sVar1;
  uchar *puVar2;
  bool bVar3;
  LIBSSH2_COMMON_METHOD **ppLStack_28;
  uint32_t mlen;
  LIBSSH2_COMMON_METHOD **method_local;
  uchar *puStack_18;
  uint32_t list_strlen_local;
  uchar *buf_local;
  
  _libssh2_htonu32(buf,list_strlen);
  puStack_18 = buf + 4;
  if ((method == (LIBSSH2_COMMON_METHOD **)0x0) ||
     (ppLStack_28 = method, *method == (LIBSSH2_COMMON_METHOD *)0x0)) {
    buf_local._4_4_ = 4;
  }
  else {
    while( true ) {
      bVar3 = false;
      if (*ppLStack_28 != (LIBSSH2_COMMON_METHOD *)0x0) {
        bVar3 = (*ppLStack_28)->name != (char *)0x0;
      }
      if (!bVar3) break;
      sVar1 = strlen((*ppLStack_28)->name);
      memcpy(puStack_18,(*ppLStack_28)->name,sVar1 & 0xffffffff);
      puVar2 = puStack_18 + (sVar1 & 0xffffffff);
      puStack_18 = puVar2 + 1;
      *puVar2 = ',';
      ppLStack_28 = ppLStack_28 + 1;
    }
    buf_local._4_4_ = list_strlen + 4;
  }
  return buf_local._4_4_;
}

Assistant:

static uint32_t
kex_method_list(unsigned char *buf, uint32_t list_strlen,
                LIBSSH2_COMMON_METHOD ** method)
{
    _libssh2_htonu32(buf, list_strlen);
    buf += 4;

    if(!method || !*method) {
        return 4;
    }

    while(*method && (*method)->name) {
        uint32_t mlen = (uint32_t)strlen((*method)->name);
        memcpy(buf, (*method)->name, mlen);
        buf += mlen;
        *(buf++) = ',';
        method++;
    }

    return list_strlen + 4;
}